

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::NotLikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
               (string_t str,string_t pattern,string_t escape)

{
  bool bVar1;
  
  bVar1 = LikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
                    (str,pattern,escape);
  return !bVar1;
}

Assistant:

static inline bool Operation(TA str, TB pattern, TC escape) {
		return !LikeEscapeOperator::Operation(str, pattern, escape);
	}